

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Gia_ManPerformGla(Gia_Man_t *pAig,Abs_Par_t *pPars)

{
  Vec_Ptr_t *p_00;
  sat_solver2 *s;
  long lVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  Abs_Par_t *p_01;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int nCexes;
  uint uVar16;
  Gia_Obj_t *pGVar17;
  Abc_Cex_t *pAVar18;
  Vec_Int_t *pVVar19;
  abctime aVar20;
  char *pcVar21;
  char *pcVar22;
  Prf_Man_t *pPVar23;
  Abc_Frame_t *pAbc;
  long lVar24;
  long lVar25;
  undefined8 in_stack_fffffffffffff9d8;
  undefined4 uVar27;
  undefined8 uVar26;
  double local_608;
  double local_5f0;
  double local_5d8;
  double local_5c0;
  double local_5a8;
  double local_590;
  char *local_570;
  char local_478 [8];
  char Command [1000];
  int nVarsOld;
  int nValues;
  int nAbs;
  int nConflsBeg;
  int nAbsOld;
  int Lit;
  int f;
  int c;
  int i;
  int fOneIsSent;
  int iFrameTryToProve;
  int RetValue;
  int Status;
  abctime clk;
  abctime clk2;
  Vec_Int_t *vPPis;
  Vec_Int_t *vCore;
  Ga2_Man_t *p;
  Abs_Par_t *pAStack_20;
  int fUseSecondCore;
  Abs_Par_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  uVar27 = (undefined4)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  p._4_4_ = 1;
  pAStack_20 = pPars;
  pPars_local = (Abs_Par_t *)pAig;
  _RetValue = Abc_Clock();
  iFrameTryToProve = 0;
  fOneIsSent = -1;
  i = -1;
  c = 0;
  pAStack_20->iFrame = -1;
  iVar9 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
  if (iVar9 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                  ,0x5e6,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
  }
  lVar24._0_4_ = pPars_local[2].nFramesMax;
  lVar24._4_4_ = pPars_local[2].nFramesStart;
  if (lVar24 != 0) {
    free(*(void **)(pPars_local + 2));
    pPars_local[2].nFramesMax = 0;
    pPars_local[2].nFramesStart = 0;
  }
  pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
  pGVar17 = Gia_ObjFanin0(pGVar17);
  iVar9 = Gia_ObjIsConst0(pGVar17);
  if (iVar9 != 0) {
    pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
    iVar9 = Gia_ObjFaninC0(pGVar17);
    if (iVar9 != 0) {
      iVar10 = Gia_ManRegNum((Gia_Man_t *)pPars_local);
      iVar11 = Gia_ManPiNum((Gia_Man_t *)pPars_local);
      pAVar18 = Abc_CexMakeTriv(iVar10,iVar11,1,0);
      *(Abc_Cex_t **)(pPars_local + 2) = pAVar18;
      Abc_Print(1,"Sequential miter is trivially SAT.\n");
    }
    else {
      Abc_Print(1,"Sequential miter is trivially UNSAT.\n");
    }
    pAig_local._4_4_ = (uint)(iVar9 == 0);
    return pAig_local._4_4_;
  }
  lVar25._0_4_ = pPars_local[2].fUseTermVars;
  lVar25._4_4_ = pPars_local[2].fUseRollback;
  if (lVar25 == 0) {
    iVar9 = Gia_ManObjNum((Gia_Man_t *)pPars_local);
    pVVar19 = Vec_IntStart(iVar9);
    *(Vec_Int_t **)&pPars_local[2].fUseTermVars = pVVar19;
    Vec_IntWriteEntry(*(Vec_Int_t **)&pPars_local[2].fUseTermVars,0,1);
    p_01 = pPars_local;
    pVVar19 = *(Vec_Int_t **)&pPars_local[2].fUseTermVars;
    pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
    iVar9 = Gia_ObjFaninId0p((Gia_Man_t *)p_01,pGVar17);
    Vec_IntWriteEntry(pVVar19,iVar9,1);
  }
  vCore = (Vec_Int_t *)Ga2_ManStart((Gia_Man_t *)pPars_local,pAStack_20);
  aVar20 = Abc_Clock();
  vCore[0xb].pArray = (int *)(aVar20 - _RetValue);
  if (vCore->pArray[0x1c] != 0) {
    Abc_Print(1,"Running gate-level abstraction (GLA) with the following parameters:\n");
    uVar26 = CONCAT44(uVar27,pAStack_20->nRatioMin2);
    Abc_Print(1,
              "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n"
              ,(ulong)(uint)pAStack_20->nFramesMax,(ulong)(uint)pAStack_20->nConfLimit,
              (ulong)(uint)pAStack_20->nTimeOut,(ulong)(uint)pAStack_20->nRatioMin,uVar26,
              pAStack_20->nRatioMax);
    Abc_Print(1,
              "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n"
              ,(ulong)(uint)pAStack_20->nLearnedStart,(ulong)(uint)pAStack_20->nLearnedDelta,
              (ulong)(uint)pAStack_20->nLearnedPerce,(ulong)(uint)pAStack_20->fUseSkip,
              CONCAT44((int)((ulong)uVar26 >> 0x20),pAStack_20->fUseSimple),
              pAStack_20->fDumpVabs | pAStack_20->fDumpMabs);
    if ((pAStack_20->fDumpVabs != 0) || (pAStack_20->fDumpMabs != 0)) {
      pcVar21 = "Miter with abstraction map";
      if (pAStack_20->fDumpVabs != 0) {
        pcVar21 = "Abstracted model";
      }
      pcVar22 = Ga2_GlaGetFileName((Ga2_Man_t *)vCore,pAStack_20->fDumpVabs);
      Abc_Print(1,"%s will be dumped into file \"%s\".\n",pcVar21,pcVar22);
    }
    Abc_Print(1,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  nAbsOld = 0;
  f = 0;
LAB_006f4683:
  bVar8 = true;
  if (pAStack_20->nFramesMax != 0) {
    bVar8 = nAbsOld < pAStack_20->nFramesMax;
  }
  if (!bVar8) {
LAB_006f5468:
    Prf_ManStopP((Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8));
    if (-1 < i) {
      Gia_GlaProveCancel(pAStack_20->fVerbose);
    }
    if (*(int *)&vCore[4].pArray == 0) {
      Abc_Print(1,"\n");
    }
    if (fOneIsSent == 1) {
      Abc_Print(1,"GLA completed %d frames and proved abstraction derived in frame %d  ",
                (ulong)(vCore->pArray[0x1f] + 1),(ulong)(uint)i);
    }
    else {
      lVar1._0_4_ = pPars_local[2].nFramesMax;
      lVar1._4_4_ = pPars_local[2].nFramesStart;
      if (lVar1 == 0) {
        Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].fUseTermVars);
        pVVar19 = Ga2_ManAbsTranslate((Ga2_Man_t *)vCore);
        *(Vec_Int_t **)&pPars_local[2].fUseTermVars = pVVar19;
        if ((vCore->pArray[8] == 0) ||
           (aVar20 = Abc_Clock(), aVar20 < *(long *)(*(long *)(vCore + 6) + 0x260))) {
          if ((pAStack_20->nConfLimit == 0) ||
             (iVar9 = sat_solver2_nconflicts(*(sat_solver2 **)(vCore + 6)),
             iVar9 < pAStack_20->nConfLimit)) {
            if ((pAStack_20->nRatioMin2 == 0) ||
               (iVar9 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray),
               iVar9 < (vCore[4].nSize * pAStack_20->nRatioMin2) / 100)) {
              if ((pAStack_20->nRatioMin == 0) ||
                 (iVar9 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray),
                 iVar9 < (vCore[4].nSize * pAStack_20->nRatioMin) / 100)) {
                Abc_Print(1,"GLA finished %d frames and produced a %d-stable abstraction.  ",
                          (ulong)(vCore->pArray[0x1f] + 1),(ulong)(uint)vCore->pArray[0x20]);
              }
              else {
                Abc_Print(1,"GLA found that the size of abstraction exceeds %d %% in frame %d.  ",
                          (ulong)(uint)pAStack_20->nRatioMin,(ulong)(vCore->pArray[0x1f] + 1));
              }
            }
            else {
              Abc_Print(1,
                        "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  "
                        ,(ulong)(uint)pAStack_20->nRatioMin2,(ulong)(vCore->pArray[0x1f] + 1));
            }
          }
          else {
            Abc_Print(1,"GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ",
                      (ulong)(uint)pAStack_20->nConfLimit,(ulong)(vCore->pArray[0x1f] + 1),
                      (ulong)(uint)vCore->pArray[0x20]);
          }
        }
        else {
          Abc_Print(1,"GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ",
                    (ulong)(uint)vCore->pArray[8],(ulong)(vCore->pArray[0x1f] + 1),
                    (ulong)(uint)vCore->pArray[0x20]);
        }
        vCore->pArray[0x1e] = vCore->pArray[0x1f];
      }
      else {
        if (vCore->pArray[0x1c] != 0) {
          Abc_Print(1,"\n");
        }
        iVar9 = Gia_ManVerifyCex((Gia_Man_t *)pPars_local,*(Abc_Cex_t **)(pPars_local + 2),0);
        if (iVar9 == 0) {
          Abc_Print(1,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
        }
        Abc_Print(1,"True counter-example detected in frame %d.  ",(ulong)(uint)nAbsOld);
        vCore->pArray[0x1e] = nAbsOld + -1;
        Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].fUseTermVars);
        fOneIsSent = 0;
      }
    }
    aVar20 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar20 - _RetValue);
    if (vCore->pArray[0x1c] != 0) {
      aVar20 = Abc_Clock();
      vCore[0xd].pArray =
           (int *)(((((aVar20 - _RetValue) - (long)vCore[0xc].pArray) - *(long *)(vCore + 0xc)) -
                   *(long *)(vCore + 0xd)) - (long)vCore[0xb].pArray);
      Abc_Print(1,"%s =","Runtime: Initializing");
      piVar2 = vCore[0xb].pArray;
      aVar20 = Abc_Clock();
      if (aVar20 == _RetValue) {
        local_590 = 0.0;
      }
      else {
        piVar3 = vCore[0xb].pArray;
        aVar20 = Abc_Clock();
        local_590 = ((double)(long)piVar3 * 100.0) / (double)(aVar20 - _RetValue);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar2 * 1.0) / 1000000.0,local_590);
      Abc_Print(1,"%s =","Runtime: Solver UNSAT");
      piVar2 = vCore[0xc].pArray;
      aVar20 = Abc_Clock();
      if (aVar20 == _RetValue) {
        local_5a8 = 0.0;
      }
      else {
        piVar3 = vCore[0xc].pArray;
        aVar20 = Abc_Clock();
        local_5a8 = ((double)(long)piVar3 * 100.0) / (double)(aVar20 - _RetValue);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar2 * 1.0) / 1000000.0,local_5a8);
      Abc_Print(1,"%s =","Runtime: Solver SAT  ");
      lVar4._0_4_ = vCore[0xc].nCap;
      lVar4._4_4_ = vCore[0xc].nSize;
      aVar20 = Abc_Clock();
      if (aVar20 == _RetValue) {
        local_5c0 = 0.0;
      }
      else {
        lVar5._0_4_ = vCore[0xc].nCap;
        lVar5._4_4_ = vCore[0xc].nSize;
        aVar20 = Abc_Clock();
        local_5c0 = ((double)lVar5 * 100.0) / (double)(aVar20 - _RetValue);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar4 * 1.0) / 1000000.0,local_5c0);
      Abc_Print(1,"%s =","Runtime: Refinement  ");
      lVar6._0_4_ = vCore[0xd].nCap;
      lVar6._4_4_ = vCore[0xd].nSize;
      aVar20 = Abc_Clock();
      if (aVar20 == _RetValue) {
        local_5d8 = 0.0;
      }
      else {
        lVar7._0_4_ = vCore[0xd].nCap;
        lVar7._4_4_ = vCore[0xd].nSize;
        aVar20 = Abc_Clock();
        local_5d8 = ((double)lVar7 * 100.0) / (double)(aVar20 - _RetValue);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar6 * 1.0) / 1000000.0,local_5d8);
      Abc_Print(1,"%s =","Runtime: Other       ");
      piVar2 = vCore[0xd].pArray;
      aVar20 = Abc_Clock();
      if (aVar20 == _RetValue) {
        local_5f0 = 0.0;
      }
      else {
        piVar3 = vCore[0xd].pArray;
        aVar20 = Abc_Clock();
        local_5f0 = ((double)(long)piVar3 * 100.0) / (double)(aVar20 - _RetValue);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)(long)piVar2 * 1.0) / 1000000.0,local_5f0);
      Abc_Print(1,"%s =","Runtime: TOTAL       ");
      aVar20 = Abc_Clock();
      lVar24 = aVar20 - _RetValue;
      aVar20 = Abc_Clock();
      if (aVar20 == _RetValue) {
        local_608 = 0.0;
      }
      else {
        aVar20 = Abc_Clock();
        lVar25 = aVar20 - _RetValue;
        aVar20 = Abc_Clock();
        local_608 = ((double)lVar25 * 100.0) / (double)(aVar20 - _RetValue);
      }
      Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)lVar24 * 1.0) / 1000000.0,local_608);
      Ga2_ManReportMemory((Ga2_Man_t *)vCore);
    }
    Ga2_ManStop((Ga2_Man_t *)vCore);
    fflush(_stdout);
    return fOneIsSent;
  }
  vCore->pArray[0x1e] = -1;
  Ga2_ManRestart((Ga2_Man_t *)vCore);
  uVar12 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray);
  nAbsOld = 0;
  do {
    bVar8 = true;
    if (pAStack_20->nFramesMax != 0) {
      bVar8 = nAbsOld < pAStack_20->nFramesMax;
    }
    if (!bVar8) goto LAB_006f5456;
    iVar10 = sat_solver2_nconflicts(*(sat_solver2 **)(vCore + 6));
    iVar11 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray);
    iVar13 = Vec_IntSize(*(Vec_Int_t **)(vCore + 3));
    iVar9 = nAbsOld;
    vCore->pArray[0x1e] = nAbsOld;
    iVar14 = Vec_PtrSize((Vec_Ptr_t *)vCore[5].pArray);
    if (iVar9 == iVar14) {
      p_00 = (Vec_Ptr_t *)vCore[5].pArray;
      pVVar19 = Vec_IntAlloc(0);
      Vec_PtrPush(p_00,pVVar19);
    }
    pVVar19 = Ga2_MapFrameMap((Ga2_Man_t *)vCore,nAbsOld);
    iVar9 = Vec_IntSize(*(Vec_Int_t **)(vCore + 3));
    Vec_IntFillExtra(pVVar19,iVar9,-1);
    Ga2_ManAddAbsClauses((Ga2_Man_t *)vCore,nAbsOld);
    pVVar19 = vCore;
    if (((vCore->pArray[0x11] == 0) || (vCore->pArray[0x1f] < nAbsOld)) &&
       ((vCore->pArray[1] == 0 || (vCore->pArray[1] < nAbsOld)))) {
      pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
      pGVar17 = Gia_ObjFanin0(pGVar17);
      iVar9 = Ga2_ObjFindLit((Ga2_Man_t *)pVVar19,pGVar17,nAbsOld);
      nConflsBeg = iVar9;
      if (iVar9 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                      ,0x62e,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
      }
      pGVar17 = Gia_ManPo((Gia_Man_t *)pPars_local,0);
      iVar14 = Gia_ObjFaninC0(pGVar17);
      nConflsBeg = Abc_LitNotCond(iVar9,iVar14);
      if (nConflsBeg != 0) {
        if (nConflsBeg < 2) {
          __assert_fail("Lit > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                        ,0x632,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
        }
        iVar9 = *(int *)&vCore[6].pArray;
        iVar14 = sat_solver2_nvars(*(sat_solver2 **)(vCore + 6));
        if (iVar14 < iVar9) {
          sat_solver2_setnvars(*(sat_solver2 **)(vCore + 6),*(int *)&vCore[6].pArray);
        }
        iVar9 = *(int *)&vCore[6].pArray;
        Lit = 0;
        while( true ) {
          s = *(sat_solver2 **)(vCore + 6);
          iVar14 = Abc_Lit2Var(nConflsBeg);
          iVar14 = var_is_assigned(s,iVar14);
          if (iVar14 != 0) break;
          clk = Abc_Clock();
          iFrameTryToProve =
               sat_solver2_solve(*(sat_solver2 **)(vCore + 6),&nConflsBeg,&nAbsOld,
                                 (long)pAStack_20->nConfLimit,0,0,0);
          if (iFrameTryToProve != 1) {
            aVar20 = Abc_Clock();
            vCore[0xc].pArray = (int *)((aVar20 - clk) + (long)vCore[0xc].pArray);
            if ((iFrameTryToProve == 0) ||
               ((*(long *)(*(long *)(vCore + 6) + 0x260) != 0 &&
                (aVar20 = Abc_Clock(), *(long *)(*(long *)(vCore + 6) + 0x260) < aVar20))))
            goto LAB_006f5468;
            if (Lit == 0) {
              if (vCore->pArray[0x1f] < nAbsOld) {
                vCore->pArray[0x20] = vCore->pArray[0x20] + 1;
              }
              goto LAB_006f50da;
            }
            if (vCore->pArray[0x1f] < nAbsOld) {
              vCore->pArray[0x20] = 0;
            }
            if (*(long *)(*(long *)(vCore + 6) + 0x1e8) == 0) {
              __assert_fail("p->pSat->pPrf2 != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                            ,0x694,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
            }
            vPPis = (Vec_Int_t *)Sat_ProofCore(*(sat_solver2 **)(vCore + 6));
            Prf_ManStopP((Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8));
            sat_solver2_rollback(*(sat_solver2 **)(vCore + 6));
            Ga2_ManShrinkAbs((Ga2_Man_t *)vCore,iVar11,iVar13,iVar9);
            if (p._4_4_ != 0) {
              if (iVar9 != **(int **)(vCore + 6)) {
                __assert_fail("nVarsOld == p->pSat->size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6a4,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              sat_solver2_bookmark(*(sat_solver2 **)(vCore + 6));
              if (*(long *)(*(long *)(vCore + 6) + 0x1e8) != 0) {
                __assert_fail("p->pSat->pPrf2 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6a7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              pPVar23 = Prf_ManAlloc();
              *(Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8) = pPVar23;
              if (*(long *)(*(long *)(vCore + 6) + 0x1e8) != 0) {
                *(undefined4 *)&vCore[3].pArray = 0;
                pVVar19 = *(Vec_Int_t **)(vCore + 2);
                iVar14 = Gia_ManObjNum(*(Gia_Man_t **)vCore);
                Vec_IntFill(pVVar19,iVar14,-1);
                pPVar23 = *(Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8);
                pVVar19 = *(Vec_Int_t **)(vCore + 2);
                iVar14 = sat_solver2_nlearnts(*(sat_solver2 **)(vCore + 6));
                iVar15 = Vec_IntSize(vPPis);
                Prf_ManRestart(pPVar23,pVVar19,iVar14,iVar15);
                Ga2_ManAddToAbs((Ga2_Man_t *)vCore,vPPis);
                Vec_IntFree(vPPis);
              }
              clk = Abc_Clock();
              iFrameTryToProve =
                   sat_solver2_solve(*(sat_solver2 **)(vCore + 6),&nConflsBeg,&nAbsOld,
                                     (long)pAStack_20->nConfLimit,0,0,0);
              if (iFrameTryToProve == 0) goto LAB_006f5468;
              if (iFrameTryToProve != -1) {
                __assert_fail("Status == l_False",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6b7,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              aVar20 = Abc_Clock();
              vCore[0xc].pArray = (int *)((aVar20 - clk) + (long)vCore[0xc].pArray);
              if (*(long *)(*(long *)(vCore + 6) + 0x1e8) == 0) {
                __assert_fail("p->pSat->pPrf2 != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                              ,0x6bb,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
              }
              vPPis = (Vec_Int_t *)Sat_ProofCore(*(sat_solver2 **)(vCore + 6));
              Prf_ManStopP((Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8));
              sat_solver2_rollback(*(sat_solver2 **)(vCore + 6));
              Ga2_ManShrinkAbs((Ga2_Man_t *)vCore,iVar11,iVar13,iVar9);
            }
            Ga2_ManAddToAbs((Ga2_Man_t *)vCore,vPPis);
            Vec_IntFree(vPPis);
            goto LAB_006f50da;
          }
          *(int *)((long)&vCore[6].pArray + 4) = *(int *)((long)&vCore[6].pArray + 4) + 1;
          aVar20 = Abc_Clock();
          *(abctime *)(vCore + 0xc) = (aVar20 - clk) + *(long *)(vCore + 0xc);
          iVar14 = Abc_FrameIsBridgeMode();
          if ((iVar14 != 0) && (c != 0)) {
            Gia_Ga2SendCancel((Ga2_Man_t *)vCore,pAStack_20->fVerbose);
            c = 0;
          }
          if (-1 < i) {
            Gia_GlaProveCancel(pAStack_20->fVerbose);
            i = -1;
          }
          clk = Abc_Clock();
          Rnm_ManSetRefId(*(Rnm_Man_t **)(vCore + 5),Lit);
          clk2 = (abctime)Ga2_ManRefine((Ga2_Man_t *)vCore);
          aVar20 = Abc_Clock();
          pVVar19 = vCore;
          iVar14 = nAbsOld;
          *(abctime *)(vCore + 0xd) = (aVar20 - clk) + *(long *)(vCore + 0xd);
          if (clk2 == 0) {
            if (pAStack_20->fVerbose != 0) {
              iVar11 = sat_solver2_nconflicts(*(sat_solver2 **)(vCore + 6));
              iVar9 = Lit;
              aVar20 = Abc_Clock();
              Ga2_ManAbsPrintFrame
                        ((Ga2_Man_t *)pVVar19,iVar14,iVar11 - iVar10,iVar9,aVar20 - _RetValue,1);
            }
            goto LAB_006f5468;
          }
          if (Lit == 0) {
            if (iVar9 != **(int **)(vCore + 6)) {
              __assert_fail("nVarsOld == p->pSat->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                            ,0x666,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
            }
            sat_solver2_bookmark(*(sat_solver2 **)(vCore + 6));
            if (*(long *)(*(long *)(vCore + 6) + 0x1e8) != 0) {
              __assert_fail("p->pSat->pPrf2 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGla.c"
                            ,0x669,"int Gia_ManPerformGla(Gia_Man_t *, Abs_Par_t *)");
            }
            pPVar23 = Prf_ManAlloc();
            *(Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8) = pPVar23;
            if (*(long *)(*(long *)(vCore + 6) + 0x1e8) != 0) {
              *(undefined4 *)&vCore[3].pArray = 0;
              pVVar19 = *(Vec_Int_t **)(vCore + 2);
              iVar14 = Gia_ManObjNum(*(Gia_Man_t **)vCore);
              Vec_IntFill(pVVar19,iVar14,-1);
              pPVar23 = *(Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8);
              pVVar19 = *(Vec_Int_t **)(vCore + 2);
              iVar14 = sat_solver2_nlearnts(*(sat_solver2 **)(vCore + 6));
              iVar15 = Vec_IntSize((Vec_Int_t *)clk2);
              Prf_ManRestart(pPVar23,pVVar19,iVar14,iVar15);
            }
          }
          else if (*(long *)(*(long *)(vCore + 6) + 0x1e8) != 0) {
            pPVar23 = *(Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8);
            iVar14 = *(int *)&vCore[3].pArray;
            iVar15 = Vec_IntSize((Vec_Int_t *)clk2);
            Prf_ManGrow(pPVar23,iVar14 + iVar15);
          }
          Ga2_ManAddToAbs((Ga2_Man_t *)vCore,(Vec_Int_t *)clk2);
          Vec_IntFree((Vec_Int_t *)clk2);
          pVVar19 = vCore;
          iVar14 = nAbsOld;
          if (pAStack_20->fVerbose != 0) {
            iVar15 = sat_solver2_nconflicts(*(sat_solver2 **)(vCore + 6));
            nCexes = Lit + 1;
            aVar20 = Abc_Clock();
            Ga2_ManAbsPrintFrame
                      ((Ga2_Man_t *)pVVar19,iVar14,iVar15 - iVar10,nCexes,aVar20 - _RetValue,0);
          }
          if ((pAStack_20->nRatioMin2 != 0) &&
             (iVar14 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray),
             (vCore[4].nSize * pAStack_20->nRatioMin2) / 100 <= iVar14)) {
            iFrameTryToProve = 0;
            goto LAB_006f5468;
          }
          Lit = Lit + 1;
        }
        Prf_ManStopP((Prf_Man_t **)(*(long *)(vCore + 6) + 0x1e8));
LAB_006f50da:
        pVVar19 = vCore;
        iVar9 = nAbsOld;
        if (vCore->pArray[0x1f] < nAbsOld) {
          vCore->pArray[0x1f] = nAbsOld;
        }
        if (pAStack_20->fVerbose != 0) {
          iVar13 = sat_solver2_nconflicts(*(sat_solver2 **)(vCore + 6));
          iVar11 = Lit;
          aVar20 = Abc_Clock();
          Ga2_ManAbsPrintFrame
                    ((Ga2_Man_t *)pVVar19,iVar9,iVar13 - iVar10,iVar11,aVar20 - _RetValue,1);
        }
        iVar9 = Gia_GlaProveCheck(pAStack_20->fVerbose);
        if (iVar9 != 0) {
          fOneIsSent = 1;
          goto LAB_006f5468;
        }
        if (0 < Lit) {
          if (vCore->pArray[0x1d] != 0) {
            Abc_Print(1,"\n");
          }
          Vec_IntFreeP((Vec_Int_t **)&pPars_local[2].fUseTermVars);
          pVVar19 = Ga2_ManAbsTranslate((Ga2_Man_t *)vCore);
          *(Vec_Int_t **)&pPars_local[2].fUseTermVars = pVVar19;
          if ((pAStack_20->nRatioMin != 0) &&
             (iVar9 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray),
             (vCore[4].nSize * pAStack_20->nRatioMin) / 100 <= iVar9)) {
            iFrameTryToProve = 0;
            goto LAB_006f5468;
          }
        }
        if (vCore->pArray[0x20] == vCore->pArray[0x21]) {
          if ((vCore->pArray[0x15] != 0) || (vCore->pArray[0x16] != 0)) {
            Abc_FrameSetStatus(-1);
            Abc_FrameSetCex((Abc_Cex_t *)0x0);
            Abc_FrameSetNFrames(nAbsOld);
            if (*(long *)(vCore->pArray + 0x1a) == 0) {
              local_570 = "glabs.aig";
            }
            else {
              local_570 = *(char **)(vCore->pArray + 0x1a);
            }
            pcVar21 = Extra_FileNameGenericAppend(local_570,".status");
            sprintf(local_478,"write_status %s",pcVar21);
            pAbc = Abc_FrameGetGlobalFrame();
            Cmd_CommandExecute(pAbc,local_478);
            Ga2_GlaDumpAbsracted((Ga2_Man_t *)vCore,pAStack_20->fVerbose);
          }
          if (vCore->pArray[0x17] != 0) {
            if (-1 < i) {
              Gia_GlaProveCancel(pAStack_20->fVerbose);
            }
            Gia_GlaProveAbsracted
                      ((Gia_Man_t *)pPars_local,pAStack_20->fSimpProver,pAStack_20->fVeryVerbose);
            i = nAbsOld;
            vCore[7].nSize = vCore[7].nSize + 1;
          }
          iVar9 = Abc_FrameIsBridgeMode();
          if (iVar9 != 0) {
            if (c != 0) {
              Gia_Ga2SendCancel((Ga2_Man_t *)vCore,pAStack_20->fVerbose);
            }
            Gia_Ga2SendAbsracted((Ga2_Man_t *)vCore,pAStack_20->fVerbose);
            c = 1;
          }
        }
        if ((((pAStack_20->nRatioMax != 0) && (0 < Lit)) &&
            ((0x14 < nAbsOld || (iVar9 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray), 100 < iVar9))))
           && (iVar9 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray),
              (int)(uVar12 * pAStack_20->nRatioMax) / 100 <= (int)(iVar9 - uVar12))) break;
      }
    }
    nAbsOld = nAbsOld + 1;
  } while( true );
  if (vCore->pArray[0x1c] != 0) {
    uVar16 = Vec_IntSize((Vec_Int_t *)vCore[2].pArray);
    Abc_Print(1,"Forcing restart because abstraction grew from %d to %d (more than %d %%).\n",
              (ulong)uVar12,(ulong)uVar16,(ulong)(uint)pAStack_20->nRatioMax);
  }
LAB_006f5456:
  f = f + 1;
  goto LAB_006f4683;
}

Assistant:

int Gia_ManPerformGla( Gia_Man_t * pAig, Abs_Par_t * pPars )
{
    int fUseSecondCore = 1;
    Ga2_Man_t * p;
    Vec_Int_t * vCore, * vPPis;
    abctime clk2, clk = Abc_Clock();
    int Status = l_Undef, RetValue = -1, iFrameTryToProve = -1, fOneIsSent = 0;
    int i, c, f, Lit;
    pPars->iFrame = -1;
    // check trivial case 
    assert( Gia_ManPoNum(pAig) == 1 ); 
    ABC_FREE( pAig->pCexSeq );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            Abc_Print( 1, "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        Abc_Print( 1, "Sequential miter is trivially SAT.\n" );
        return 0;
    }
    // create gate classes if not given
    if ( pAig->vGateClasses == NULL )
    {
        pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
        Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
        Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
    }
    // start the manager
    p = Ga2_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  Limit = %d %%  Limit2 = %d %%  RatioMax = %d %%\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin, pPars->nRatioMin2, pPars->nRatioMax );
        Abc_Print( 1, "LrnStart = %d  LrnDelta = %d  LrnRatio = %d %%  Skip = %d  SimpleCNF = %d  Dump = %d\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce, pPars->fUseSkip, pPars->fUseSimple, pPars->fDumpVabs|pPars->fDumpMabs );
        if ( pPars->fDumpVabs || pPars->fDumpMabs )
            Abc_Print( 1, "%s will be dumped into file \"%s\".\n", 
                pPars->fDumpVabs ? "Abstracted model" : "Miter with abstraction map",
                Ga2_GlaGetFileName(p, pPars->fDumpVabs) );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    // iterate unrolling
    for ( i = f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; i++ )
    {
        int nAbsOld;
        // remember the timeframe
        p->pPars->iFrame = -1;
        // create new SAT solver
        Ga2_ManRestart( p );
        // remember abstraction size after the last restart
        nAbsOld = Vec_IntSize(p->vAbs);
        // unroll the circuit
        for ( f = 0; !pPars->nFramesMax || f < pPars->nFramesMax; f++ )
        {
            // remember current limits
            int nConflsBeg = sat_solver2_nconflicts(p->pSat);
            int nAbs       = Vec_IntSize(p->vAbs);
            int nValues    = Vec_IntSize(p->vValues);
            int nVarsOld;
            // remember the timeframe
            p->pPars->iFrame = f;
            // extend and clear storage
            if ( f == Vec_PtrSize(p->vId2Lit) )
                Vec_PtrPush( p->vId2Lit, Vec_IntAlloc(0) );
            Vec_IntFillExtra( Ga2_MapFrameMap(p, f), Vec_IntSize(p->vValues), -1 );
            // add static clauses to this timeframe
            Ga2_ManAddAbsClauses( p, f );
            // skip checking if skipcheck is enabled (&gla -s)
            if ( p->pPars->fUseSkip && f <= p->pPars->iFrameProved )
                continue;
            // skip checking if we need to skip several starting frames (&gla -S <num>)
            if ( p->pPars->nFramesStart && f <= p->pPars->nFramesStart )
                continue;
            // get the output literal
//            Lit = Ga2_ManUnroll_rec( p, Gia_ManPo(pAig,0), f );
            Lit = Ga2_ObjFindLit( p, Gia_ObjFanin0(Gia_ManPo(pAig,0)), f );
            assert( Lit >= 0 );
            Lit = Abc_LitNotCond( Lit, Gia_ObjFaninC0(Gia_ManPo(pAig,0)) );
            if ( Lit == 0 )
                continue;
            assert( Lit > 1 );
            // check for counter-examples
            if ( p->nSatVars > sat_solver2_nvars(p->pSat) )
                sat_solver2_setnvars( p->pSat, p->nSatVars );
            nVarsOld = p->nSatVars;
            for ( c = 0; ; c++ )
            {
                // consider the special case when the target literal is implied false
                // by implications which happened as a result of previous refinements
                // note that incremental UNSAT core cannot be computed because there is no learned clauses
                // in this case, we will assume that UNSAT core cannot reduce the problem
                if ( var_is_assigned(p->pSat, Abc_Lit2Var(Lit)) )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    break;
                }
                // perform SAT solving
                clk2 = Abc_Clock();
                Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( Status == l_True ) // perform refinement
                {
                    p->nCexes++;
                    p->timeSat += Abc_Clock() - clk2;

                    // cancel old one if it was sent
                    if ( Abc_FrameIsBridgeMode() && fOneIsSent )
                    {
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                        fOneIsSent = 0;
                    }
                    if ( iFrameTryToProve >= 0 )
                    {
                        Gia_GlaProveCancel( pPars->fVerbose );
                        iFrameTryToProve = -1;
                    }

                    // perform refinement
                    clk2 = Abc_Clock();
                    Rnm_ManSetRefId( p->pRnm, c );
                    vPPis = Ga2_ManRefine( p );
                    p->timeCex += Abc_Clock() - clk2;
                    if ( vPPis == NULL )
                    {
                        if ( pPars->fVerbose )
                            Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
                        goto finish;
                    }

                    if ( c == 0 )
                    {
//                        Ga2_ManRefinePrintPPis( p );
                        // create bookmark to be used for rollback
                        assert( nVarsOld == p->pSat->size );
                        sat_solver2_bookmark( p->pSat );
                        // start incremental proof manager
                        assert( p->pSat->pPrf2 == NULL );
                        p->pSat->pPrf2 = Prf_ManAlloc();
                        if ( p->pSat->pPrf2 )
                        {
                            p->nProofIds = 0;
                            Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                            Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                        }
                    }
                    else
                    {
                        // resize the proof logger
                        if ( p->pSat->pPrf2 )
                            Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
                    }

                    Ga2_ManAddToAbs( p, vPPis );
                    Vec_IntFree( vPPis );
                    if ( pPars->fVerbose )
                        Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c+1, Abc_Clock() - clk, 0 );
                    // check if the number of objects is below limit
                    if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
                    {
                        Status = l_Undef;
                        goto finish;
                    }
                    continue;
                }
                p->timeUnsat += Abc_Clock() - clk2;
                if ( Status == l_Undef ) // ran out of resources
                    goto finish;
                if ( p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit ) // timeout
                    goto finish;
                if ( c == 0 )
                {
                    if ( f > p->pPars->iFrameProved )
                        p->pPars->nFramesNoChange++;
                    break;
                }
                if ( f > p->pPars->iFrameProved )
                    p->pPars->nFramesNoChange = 0;

                // derive the core
                assert( p->pSat->pPrf2 != NULL );
                vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                Prf_ManStopP( &p->pSat->pPrf2 );
                // update the SAT solver
                sat_solver2_rollback( p->pSat );
                // reduce abstraction
                Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );

                // purify UNSAT core
                if ( fUseSecondCore )
                {
//                    int nOldCore = Vec_IntSize(vCore);
                    // reverse the order of objects in the core
//                    Vec_IntSort( vCore, 0 );
//                    Vec_IntPrint( vCore );
                    // create bookmark to be used for rollback
                    assert( nVarsOld == p->pSat->size );
                    sat_solver2_bookmark( p->pSat );
                    // start incremental proof manager
                    assert( p->pSat->pPrf2 == NULL );
                    p->pSat->pPrf2 = Prf_ManAlloc();
                    if ( p->pSat->pPrf2 )
                    {
                        p->nProofIds = 0;
                        Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                        Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vCore) );

                        Ga2_ManAddToAbs( p, vCore );
                        Vec_IntFree( vCore );
                    }
                    // run SAT solver
                    clk2 = Abc_Clock();
                    Status = sat_solver2_solve( p->pSat, &Lit, &Lit+1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                    if ( Status == l_Undef )
                        goto finish;
                    assert( Status == l_False );
                    p->timeUnsat += Abc_Clock() - clk2;

                    // derive the core
                    assert( p->pSat->pPrf2 != NULL );
                    vCore = (Vec_Int_t *)Sat_ProofCore( p->pSat );
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    // update the SAT solver
                    sat_solver2_rollback( p->pSat );
                    // reduce abstraction
                    Ga2_ManShrinkAbs( p, nAbs, nValues, nVarsOld );
//                    printf( "\n%4d -> %4d\n", nOldCore, Vec_IntSize(vCore) );
                }

                Ga2_ManAddToAbs( p, vCore );
//                Ga2_ManRefinePrint( p, vCore );
                Vec_IntFree( vCore );
                break;
            }
            // remember the last proved frame
            if ( p->pPars->iFrameProved < f )
                p->pPars->iFrameProved = f;
            // print statistics
            if ( pPars->fVerbose )
                Ga2_ManAbsPrintFrame( p, f, sat_solver2_nconflicts(p->pSat)-nConflsBeg, c, Abc_Clock() - clk, 1 );
            // check if abstraction was proved
            if ( Gia_GlaProveCheck( pPars->fVerbose ) )
            {
                RetValue = 1;
                goto finish;
            }
            if ( c > 0 ) 
            {
                if ( p->pPars->fVeryVerbose )
                    Abc_Print( 1, "\n" );
                // recompute the abstraction
                Vec_IntFreeP( &pAig->vGateClasses );
                pAig->vGateClasses = Ga2_ManAbsTranslate( p );
                // check if the number of objects is below limit
                if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
                {
                    Status = l_Undef;
                    goto finish;
                }
            }
            // check the number of stable frames
            if ( p->pPars->nFramesNoChange == p->pPars->nFramesNoChangeLim )
            {
                // dump the model into file
                if ( p->pPars->fDumpVabs || p->pPars->fDumpMabs )
                {
                    char Command[1000];
                    Abc_FrameSetStatus( -1 );
                    Abc_FrameSetCex( NULL );
                    Abc_FrameSetNFrames( f );
                    sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status"));
                    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                    Ga2_GlaDumpAbsracted( p, pPars->fVerbose );
                }
                // call the prover
                if ( p->pPars->fCallProver )
                {
                    // cancel old one if it is proving
                    if ( iFrameTryToProve >= 0 )
                        Gia_GlaProveCancel( pPars->fVerbose );
                    // prove new one
                    Gia_GlaProveAbsracted( pAig, pPars->fSimpProver, pPars->fVeryVerbose );
                    iFrameTryToProve = f;
                    p->nPdrCalls++;
                }
                // speak to the bridge
                if ( Abc_FrameIsBridgeMode() )
                {
                    // cancel old one if it was sent
                    if ( fOneIsSent )
                        Gia_Ga2SendCancel( p, pPars->fVerbose );
                    // send new one 
                    Gia_Ga2SendAbsracted( p, pPars->fVerbose );
                    fOneIsSent = 1;
                }
            }
            // if abstraction grew more than a certain percentage, force a restart
            if ( pPars->nRatioMax == 0 )
                continue;
            if ( c > 0 && (f > 20 || Vec_IntSize(p->vAbs) > 100) && Vec_IntSize(p->vAbs) - nAbsOld >= nAbsOld * pPars->nRatioMax / 100 )
            {
                if ( p->pPars->fVerbose )
                Abc_Print( 1, "Forcing restart because abstraction grew from %d to %d (more than %d %%).\n", 
                    nAbsOld, Vec_IntSize(p->vAbs), pPars->nRatioMax );
                break;
            }
        }
    }
finish:
    Prf_ManStopP( &p->pSat->pPrf2 );
    // cancel old one if it is proving
    if ( iFrameTryToProve >= 0 )
        Gia_GlaProveCancel( pPars->fVerbose );
    // analize the results
    if ( !p->fUseNewLine )
        Abc_Print( 1, "\n" );
    if ( RetValue == 1 )
        Abc_Print( 1, "GLA completed %d frames and proved abstraction derived in frame %d  ", p->pPars->iFrameProved+1, iFrameTryToProve );
    else if ( pAig->pCexSeq == NULL )
    {
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Ga2_ManAbsTranslate( p );
        if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
            Abc_Print( 1, "GLA reached timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
            Abc_Print( 1, "GLA exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        else if ( pPars->nRatioMin2 && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin2 / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d during refinement.  ", pPars->nRatioMin2, p->pPars->iFrameProved+1 );
        else if ( pPars->nRatioMin && Vec_IntSize(p->vAbs) >= p->nMarked * pPars->nRatioMin / 100 )
            Abc_Print( 1, "GLA found that the size of abstraction exceeds %d %% in frame %d.  ", pPars->nRatioMin, p->pPars->iFrameProved+1 );
        else
            Abc_Print( 1, "GLA finished %d frames and produced a %d-stable abstraction.  ", p->pPars->iFrameProved+1, p->pPars->nFramesNoChange );
        p->pPars->iFrame = p->pPars->iFrameProved;
    }
    else
    {
        if ( p->pPars->fVerbose )
            Abc_Print( 1, "\n" );
        if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "True counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = f - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Ga2_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( p->pGia, p->pPars, p->pSat, p->pPars->iFrameProved, 0 );
    Ga2_ManStop( p );
    fflush( stdout );
    return RetValue;
}